

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_compressBlock_greedy_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *ilimit_w;
  undefined8 *puVar1;
  uint uVar2;
  ZSTD_matchState_t *pZVar3;
  undefined8 uVar4;
  uint uVar5;
  size_t sVar6;
  seqDef *psVar7;
  uint uVar8;
  BYTE *pBVar9;
  BYTE *pBVar10;
  long lVar11;
  int *piVar12;
  ulong uVar13;
  BYTE *litEnd_1;
  int *piVar14;
  U32 UVar15;
  BYTE *litEnd;
  int *iend;
  ulong uVar16;
  U32 UVar17;
  U32 UVar18;
  BYTE *litLimit_w;
  size_t offbaseFound;
  U32 local_a4;
  size_t local_88;
  BYTE *local_80;
  BYTE *local_78;
  int *local_70;
  uint local_68;
  uint local_64;
  BYTE *local_60;
  BYTE *local_58;
  BYTE *local_50;
  U32 *local_48;
  BYTE *local_40;
  BYTE *local_38;
  
  local_50 = (BYTE *)((long)src + srcSize);
  local_70 = (int *)((long)src + (srcSize - 8));
  local_78 = (ms->window).base;
  uVar2 = (ms->window).dictLimit;
  local_80 = local_78 + uVar2;
  uVar5 = (ms->cParams).minMatch;
  uVar8 = 6;
  if (uVar5 < 6) {
    uVar8 = uVar5;
  }
  local_68 = 4;
  if (4 < uVar8) {
    local_68 = uVar8;
  }
  pZVar3 = ms->dictMatchState;
  local_60 = (pZVar3->window).nextSrc;
  local_38 = (pZVar3->window).base;
  local_40 = local_38 + (pZVar3->window).dictLimit;
  UVar18 = *rep;
  piVar12 = (int *)((ulong)(((int)src - ((int)local_40 + (int)local_80)) + (int)local_60 == 0) +
                   (long)src);
  local_a4 = rep[1];
  ms->lazySkipping = 0;
  if (piVar12 < local_70) {
    local_64 = ((int)local_38 - (int)local_60) + uVar2;
    local_58 = local_38 + -(ulong)local_64;
    ilimit_w = (int *)(local_50 + -0x20);
    local_48 = rep;
    do {
      iend = (int *)((long)piVar12 + 1);
      uVar5 = (((int)piVar12 - (int)local_78) - UVar18) + 1;
      piVar14 = (int *)(local_78 + uVar5);
      if (uVar5 < uVar2) {
        piVar14 = (int *)(local_38 + (uVar5 - local_64));
      }
      UVar17 = UVar18;
      if ((uVar5 - uVar2 < 0xfffffffd) && (*piVar14 == *iend)) {
        pBVar9 = local_50;
        if (uVar5 < uVar2) {
          pBVar9 = local_60;
        }
        sVar6 = ZSTD_count_2segments
                          ((BYTE *)((long)piVar12 + 5),(BYTE *)(piVar14 + 1),local_50,pBVar9,
                           local_80);
        uVar16 = sVar6 + 4;
        UVar15 = 1;
LAB_01d2ae58:
        uVar13 = (long)iend - (long)src;
        pBVar9 = seqStore->lit;
        if (ilimit_w < iend) {
          ZSTD_safecopyLiterals(pBVar9,(BYTE *)src,(BYTE *)iend,(BYTE *)ilimit_w);
LAB_01d2ae82:
          seqStore->lit = seqStore->lit + uVar13;
          psVar7 = seqStore->sequences;
          if (0xffff < uVar13) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar7 - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          uVar4 = *(undefined8 *)((long)src + 8);
          *(undefined8 *)pBVar9 = *src;
          *(undefined8 *)(pBVar9 + 8) = uVar4;
          pBVar9 = seqStore->lit;
          if (0x10 < uVar13) {
            uVar4 = *(undefined8 *)((long)src + 0x18);
            *(undefined8 *)(pBVar9 + 0x10) = *(undefined8 *)((long)src + 0x10);
            *(undefined8 *)(pBVar9 + 0x18) = uVar4;
            if (0x20 < (long)uVar13) {
              lVar11 = 0;
              do {
                puVar1 = (undefined8 *)((long)src + lVar11 + 0x20);
                uVar4 = puVar1[1];
                pBVar10 = pBVar9 + lVar11 + 0x20;
                *(undefined8 *)pBVar10 = *puVar1;
                *(undefined8 *)(pBVar10 + 8) = uVar4;
                puVar1 = (undefined8 *)((long)src + lVar11 + 0x30);
                uVar4 = puVar1[1];
                *(undefined8 *)(pBVar10 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar10 + 0x18) = uVar4;
                lVar11 = lVar11 + 0x20;
              } while (pBVar10 + 0x20 < pBVar9 + uVar13);
            }
            goto LAB_01d2ae82;
          }
          seqStore->lit = pBVar9 + uVar13;
          psVar7 = seqStore->sequences;
        }
        psVar7->litLength = (U16)uVar13;
        psVar7->offBase = UVar15;
        if (0xffff < uVar16 - 3) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar7 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar7->mlBase = (U16)(uVar16 - 3);
        seqStore->sequences = psVar7 + 1;
        if (ms->lazySkipping != 0) {
          ms->lazySkipping = 0;
        }
        src = (void *)((long)iend + uVar16);
        piVar12 = (int *)src;
        UVar18 = UVar17;
        if (src <= local_70) {
          do {
            UVar15 = local_a4;
            uVar5 = ((int)src - (int)local_78) - UVar15;
            pBVar9 = local_78;
            if (uVar5 < uVar2) {
              pBVar9 = local_58;
            }
            piVar12 = (int *)src;
            UVar18 = UVar17;
            local_a4 = UVar15;
            if ((0xfffffffc < uVar5 - uVar2) || (*(int *)(pBVar9 + uVar5) != *src)) break;
            pBVar10 = local_50;
            if (uVar5 < uVar2) {
              pBVar10 = local_60;
            }
            sVar6 = ZSTD_count_2segments
                              ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar9 + uVar5) + 4),local_50
                               ,pBVar10,local_80);
            pBVar9 = seqStore->lit;
            if (ilimit_w < src) {
              ZSTD_safecopyLiterals(pBVar9,(BYTE *)src,(BYTE *)src,(BYTE *)ilimit_w);
            }
            else {
              uVar4 = *(undefined8 *)((long)src + 8);
              *(undefined8 *)pBVar9 = *src;
              *(undefined8 *)(pBVar9 + 8) = uVar4;
            }
            psVar7 = seqStore->sequences;
            psVar7->litLength = 0;
            psVar7->offBase = 1;
            if (0xffff < sVar6 + 1) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar7 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar7->mlBase = (U16)(sVar6 + 1);
            seqStore->sequences = psVar7 + 1;
            src = (void *)((long)src + sVar6 + 4);
            piVar12 = (int *)src;
            UVar18 = UVar15;
            local_a4 = UVar17;
            UVar17 = UVar15;
          } while (src <= local_70);
        }
      }
      else {
        local_88 = 999999999;
        if (local_68 == 6) {
          uVar16 = ZSTD_HcFindBestMatch_dictMatchState_6(ms,(BYTE *)piVar12,local_50,&local_88);
        }
        else if (local_68 == 5) {
          uVar16 = ZSTD_HcFindBestMatch_dictMatchState_5(ms,(BYTE *)piVar12,local_50,&local_88);
        }
        else {
          uVar16 = ZSTD_HcFindBestMatch_dictMatchState_4(ms,(BYTE *)piVar12,local_50,&local_88);
        }
        uVar13 = local_88;
        piVar14 = piVar12;
        if (uVar16 == 0) {
          uVar13 = 1;
          piVar14 = iend;
        }
        iend = piVar14;
        UVar15 = (U32)uVar13;
        if (3 < uVar16) {
          if (3 < local_88) {
            uVar13 = (long)piVar12 + (-0xfffffffd - (long)(local_78 + local_88));
            pBVar10 = local_78;
            pBVar9 = local_80;
            if ((uint)uVar13 < uVar2) {
              pBVar10 = local_58;
              pBVar9 = local_40;
            }
            if ((src < piVar12) && (uVar13 = uVar13 & 0xffffffff, pBVar9 < pBVar10 + uVar13)) {
              pBVar10 = pBVar10 + uVar13;
              do {
                piVar12 = (int *)((long)iend + -1);
                pBVar10 = pBVar10 + -1;
                if ((*(BYTE *)piVar12 != *pBVar10) ||
                   (uVar16 = uVar16 + 1, iend = piVar12, piVar12 <= src)) break;
              } while (pBVar9 < pBVar10);
            }
            UVar17 = UVar15 - 3;
            local_a4 = UVar18;
          }
          goto LAB_01d2ae58;
        }
        ms->lazySkipping = (uint)(0x7ff < (ulong)((long)piVar12 - (long)src));
        piVar12 = (int *)((long)piVar12 + ((ulong)((long)piVar12 - (long)src) >> 8) + 1);
      }
      rep = local_48;
    } while (piVar12 < local_70);
  }
  *rep = UVar18;
  rep[1] = local_a4;
  return (long)local_50 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_greedy_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 0, ZSTD_dictMatchState);
}